

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

cmJSONHelper<std::string,_cmCTestResourceSpec::ReadFileResult> *
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::String
          (cmJSONHelper<std::string,_cmCTestResourceSpec::ReadFileResult> *__return_storage_ptr__,
          ReadFileResult success,ReadFileResult fail,string *defval)

{
  undefined1 local_38 [40];
  
  local_38._0_4_ = success;
  local_38._4_4_ = fail;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)defval);
  std::function<cmCTestResourceSpec::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::String(cmCTestResourceSpec::ReadFileResult,cmCTestResourceSpec::ReadFileResult,std::__cxx11::string_const&)::_lambda(std::__cxx11::string&,Json::Value_const*)_1_,void>
            ((function<cmCTestResourceSpec::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>
              *)__return_storage_ptr__,(anon_class_40_3_5a0d8fdd *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::string, E, CallState...> String(
    E success, E fail, const std::string& defval = "")
  {
    return [success, fail, defval](std::string& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isString()) {
        return fail;
      }
      out = value->asString();
      return success;
    };
  }